

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O2

void * llvm::object_creator<llvm::cl::SubCommand>::call(void)

{
  SubCommand *this;
  
  this = (SubCommand *)operator_new(0xa8);
  memset(this,0,0xa8);
  cl::SubCommand::SubCommand(this);
  return this;
}

Assistant:

static void *call() { return new C(); }